

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::AttachmentPromiseNode<capnproto_test::capnp::test::TestInterface::Client>::
~AttachmentPromiseNode
          (AttachmentPromiseNode<capnproto_test::capnp::test::TestInterface::Client> *this)

{
  long *plVar1;
  undefined8 *puVar2;
  PromiseArenaMember *node;
  
  AttachmentPromiseNodeBase::dropDependency(&this->super_AttachmentPromiseNodeBase);
  plVar1 = *(long **)&(this->attachment).field_0x10;
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)&(this->attachment).field_0x10 = 0;
    puVar2 = *(undefined8 **)&(this->attachment).field_0x8;
    (**(code **)*puVar2)(puVar2,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  (this->super_AttachmentPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR___cxa_pure_virtual_006dcea8;
  node = &((this->super_AttachmentPromiseNodeBase).dependency.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->super_AttachmentPromiseNodeBase).dependency.ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node);
  }
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

~AttachmentPromiseNode() noexcept(false) {
    // We need to make sure the dependency is deleted before we delete the attachment because the
    // dependency may be using the attachment.
    dropDependency();
  }